

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::CollectSiteEdges(S2Builder *this,S2PointIndex<int> *site_index)

{
  double dVar1;
  pointer ppVar2;
  pointer pVVar3;
  pointer pRVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  S2Point *point;
  S2Point *point_00;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  *__range2;
  s2textformat *this_00;
  s2textformat *this_01;
  Result *result;
  pointer pRVar8;
  ulong uVar9;
  compact_array_base<int,_std::allocator<int>_> *this_02;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2ClosestPointQueryEdgeTarget target;
  S2ClosestPointQueryOptions options;
  S2ClosestPointQuery<int> site_query;
  _Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  local_478;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *local_458;
  undefined **local_450;
  undefined **local_448;
  ulong local_440;
  string local_438;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  string local_400;
  S2ClosestPointQueryBaseOptions<S2MinDistance> local_3e0;
  S2ClosestPointQuery<int> local_3c0;
  
  S2ClosestPointQueryBaseOptions<S2MinDistance>::S2ClosestPointQueryBaseOptions(&local_3e0);
  S2ClosestPointQueryOptions::set_conservative_max_distance
            ((S2ClosestPointQueryOptions *)&local_3e0,
             (S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  S2ClosestPointQuery<int>::S2ClosestPointQuery
            (&local_3c0,site_index,(Options_conflict *)&local_3e0);
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458 = &this->edge_sites_;
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::resize(local_458,
           (long)(this->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  local_448 = &PTR__S2DistanceTarget_00305a18;
  local_450 = &PTR__S2DistanceTarget_00304d10;
  uVar9 = 0;
  while (ppVar2 = (this->input_edges_).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(this->input_edges_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3)) {
    pVVar3 = (this->input_vertices_).
             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = (s2textformat *)(pVVar3 + ppVar2[uVar9].first);
    this_01 = (s2textformat *)(pVVar3 + ppVar2[uVar9].second);
    if (s2builder_verbose == true) {
      poVar7 = std::operator<<((ostream *)&std::cout,"S2Polyline: ");
      s2textformat::ToString_abi_cxx11_(&local_438,this_00,point);
      poVar7 = std::operator<<(poVar7,(string *)&local_438);
      poVar7 = std::operator<<(poVar7,", ");
      s2textformat::ToString_abi_cxx11_(&local_400,this_01,point_00);
      poVar7 = std::operator<<(poVar7,(string *)&local_400);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_438);
    }
    local_438.field_2._8_8_ = *(undefined8 *)(this_00 + 0x10);
    local_438._M_string_length = *(size_type *)this_00;
    local_438.field_2._M_allocated_capacity = *(undefined8 *)(this_00 + 8);
    local_408 = *(undefined8 *)(this_01 + 0x10);
    local_418 = *(undefined8 *)this_01;
    uStack_410 = *(undefined8 *)(this_01 + 8);
    local_438._M_dataplus._M_p = (pointer)local_450;
    S2ClosestPointQuery<int>::FindClosestPoints
              (&local_3c0,(Target *)&local_438,
               (vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                *)&local_478);
    this_02 = &(local_458->
               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar9].
               super_compact_array_base<int,_std::allocator<int>_>;
    local_440 = uVar9;
    gtl::compact_array_base<int,_std::allocator<int>_>::reallocate
              (this_02,(size_type_conflict)
                       ((ulong)((long)local_478._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_478._M_impl.super__Vector_impl_data._M_start) >> 4));
    pRVar4 = local_478._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar8 = local_478._M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar4;
        pRVar8 = pRVar8 + 1) {
      gtl::compact_array_base<int,_std::allocator<int>_>::push_back
                (this_02,(value_type_conflict2 *)pRVar8->point_data_);
      if ((this->snapping_needed_ == false) &&
         (dVar1 = (this->min_edge_site_separation_ca_limit_).length2_,
         (pRVar8->distance_).super_S1ChordAngle.length2_ <= dVar1 &&
         dVar1 != (pRVar8->distance_).super_S1ChordAngle.length2_)) {
        bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                          ((BasicVector<Vector3,_double,_3UL> *)
                           &(pRVar8->point_data_->tuple_).
                            super__Tuple_impl<0UL,_Vector3<double>,_int>.
                            super__Head_base<0UL,_Vector3<double>,_false>,(D *)this_00);
        if (bVar5) {
          bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)
                             &(pRVar8->point_data_->tuple_).
                              super__Tuple_impl<0UL,_Vector3<double>,_int>.
                              super__Head_base<0UL,_Vector3<double>,_false>,(D *)this_01);
          if (bVar5) {
            iVar6 = s2pred::CompareEdgeDistance
                              (&(pRVar8->point_data_->tuple_).
                                super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl,
                               (S2Point *)this_00,(S2Point *)this_01,
                               (S1ChordAngle)(this->min_edge_site_separation_ca_).length2_);
            if (iVar6 < 0) {
              this->snapping_needed_ = true;
            }
          }
        }
      }
    }
    SortSitesByDistance(this,(S2Point *)this_00,(compact_array<int,_std::allocator<int>_> *)this_02)
    ;
    uVar9 = local_440 + 1;
  }
  std::
  _Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ::~_Vector_base(&local_478);
  S2ClosestPointQueryBase<S2MinDistance,_int>::~S2ClosestPointQueryBase(&local_3c0.base_);
  return;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}